

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

ptrdiff_t toml::detail::check_utf8_validity(string *reg)

{
  bool bVar1;
  const_iterator __first;
  type __last;
  bool local_121;
  difference_type error_location;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_f0;
  undefined1 local_e8 [8];
  result<toml::detail::region,_toml::detail::none_t> u8;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  location loc;
  string *reg_local;
  
  loc.iter_._M_current = (char *)reg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"tmp",&local_81);
  location::location((location *)local_60,&local_80,(string *)loc.iter_._M_current);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  repeat<toml::detail::either<toml::detail::in_range<'\x00',_'\x7f'>,_toml::detail::sequence<toml::detail::in_range<'\xc2',_'\xdf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xe0'>,_toml::detail::in_range<'\xa0',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xe1',_'\xec'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xed'>,_toml::detail::in_range<'\x80',_'\x9f'>_>,_toml::detail::sequence<toml::detail::in_range<'\xee',_'\xef'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xf0'>,_toml::detail::in_range<'\x90',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xf1',_'\xf3'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xf4'>,_toml::detail::in_range<'\x80',_'\x8f'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::unlimited>
  ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_e8,(location *)local_60);
  bVar1 = toml::result::operator_cast_to_bool((result *)local_e8);
  local_121 = true;
  if (bVar1) {
    local_f0._M_current = (char *)location::iter((location *)local_60);
    error_location = (difference_type)location::end((location *)local_60);
    local_121 = __gnu_cxx::operator!=
                          (&local_f0,
                           (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                            *)&error_location);
  }
  if (local_121 == false) {
    reg_local = (string *)0xffffffffffffffff;
  }
  else {
    __first = location::begin((location *)local_60);
    __last = location::iter((location *)local_60);
    reg_local = (string *)
                std::
                distance<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                          ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                            )__first._M_current,
                           (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                            )__last._M_current);
    if ((long)reg_local < 0) {
      __assert_fail("0 <= error_location",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/toml11/toml/parser.hpp"
                    ,0x1ca,"std::ptrdiff_t toml::detail::check_utf8_validity(const std::string &)");
    }
  }
  result<toml::detail::region,_toml::detail::none_t>::~result
            ((result<toml::detail::region,_toml::detail::none_t> *)local_e8);
  location::~location((location *)local_60);
  return (ptrdiff_t)reg_local;
}

Assistant:

inline std::ptrdiff_t check_utf8_validity(const std::string& reg)
{
    location loc("tmp", reg);
    const auto u8 = repeat<lex_utf8_code, unlimited>::invoke(loc);
    if(!u8 || loc.iter() != loc.end())
    {
        const auto error_location = std::distance(loc.begin(), loc.iter());
        assert(0 <= error_location);
        return error_location;
    }
    return -1;
}